

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  if (e->k == VRELOC) {
    uVar3 = fs->f->code[(e->u).info];
    if ((uVar3 & 0x7f) == 0x33) {
      iVar2 = (int)fs->f->lineinfo[(long)fs->pc + -1];
      if (iVar2 == -0x80) {
        fs->nabslineinfo = fs->nabslineinfo + -1;
        fs->iwthabs = 0x81;
      }
      else {
        fs->previousline = fs->previousline - iVar2;
        fs->iwthabs = fs->iwthabs + 0xff;
      }
      fs->pc = fs->pc + -1;
      uVar3 = (uint)(cond == 0) * 0x8000 + (uVar3 >> 9 & 0x7f80) + 0x42;
      goto LAB_001392b1;
    }
  }
  discharge2anyreg(fs,e);
  if (e->k == VNONRELOC) {
    iVar2 = (e->u).info;
    iVar1 = luaY_nvarstack(fs);
    if (iVar1 <= iVar2) {
      fs->freereg = fs->freereg + 0xff;
    }
  }
  uVar3 = cond << 0xf | (e->u).info << 0x10 | 0x7fc3;
LAB_001392b1:
  luaK_code(fs,uVar3);
  iVar2 = luaK_code(fs,0x7fffff38);
  return iVar2;
}

Assistant:

static int jumponcond (FuncState *fs, expdesc *e, int cond) {
  if (e->k == VRELOC) {
    Instruction ie = getinstruction(fs, e);
    if (GET_OPCODE(ie) == OP_NOT) {
      removelastinstruction(fs);  /* remove previous OP_NOT */
      return condjump(fs, OP_TEST, GETARG_B(ie), 0, 0, !cond);
    }
    /* else go through */
  }
  discharge2anyreg(fs, e);
  freeexp(fs, e);
  return condjump(fs, OP_TESTSET, NO_REG, e->u.info, 0, cond);
}